

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# propagate_join.cpp
# Opt level: O2

unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>,_true> __thiscall
duckdb::StatisticsPropagator::PropagateStatistics
          (StatisticsPropagator *this,LogicalPositionalJoin *join,
          unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
          *node_ptr)

{
  vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
  *this_00;
  pointer *this_01;
  ulong uVar1;
  pointer pNVar2;
  type pNVar3;
  reference pvVar4;
  pointer pLVar5;
  iterator iVar6;
  pointer pBVar7;
  ulong uVar8;
  ColumnBinding *binding;
  ulong __n;
  pointer pCVar9;
  pointer *this_02;
  vector<duckdb::ColumnBinding,_true> left_bindings;
  vector<duckdb::ColumnBinding,_true> right_bindings;
  
  this_00 = (vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
             *)(node_ptr + 2);
  vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
  ::get<true>(this_00,0);
  PropagateStatistics((StatisticsPropagator *)&left_bindings,
                      (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                       *)join);
  pCVar9 = left_bindings.super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
           .super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
           _M_impl.super__Vector_impl_data._M_start;
  this_01 = &(join->super_LogicalUnconditionalJoin).super_LogicalOperator.types.
             super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
             super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  left_bindings.super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
  super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  ::std::__uniq_ptr_impl<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>_>::
  reset((__uniq_ptr_impl<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>_> *)
        this_01,(pointer)pCVar9);
  ::std::unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>_>::
  ~unique_ptr((unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>_> *)
              &left_bindings);
  __n = 1;
  do {
    if ((ulong)((long)node_ptr[3].
                      super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                      ._M_t.
                      super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                      .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl -
                (long)node_ptr[2].
                      super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                      ._M_t.
                      super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                      .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl >> 3) <=
        __n) {
      pvVar4 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
               ::get<true>(this_00,0);
      pLVar5 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
               ::operator->(pvVar4);
      (*pLVar5->_vptr_LogicalOperator[2])(&left_bindings,pLVar5);
      this_02 = &(join->super_LogicalUnconditionalJoin).super_LogicalOperator.children.
                 super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
                 .
                 super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      for (pCVar9 = left_bindings.
                    super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
                    super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pCVar9 != left_bindings.
                    super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
                    super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
                    ._M_impl.super__Vector_impl_data._M_finish; pCVar9 = pCVar9 + 1) {
        iVar6 = ::std::
                _Hashtable<duckdb::ColumnBinding,_std::pair<const_duckdb::ColumnBinding,_duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>,_std::allocator<std::pair<const_duckdb::ColumnBinding,_duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>_>,_std::__detail::_Select1st,_duckdb::ColumnBindingEquality,_duckdb::ColumnBindingHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::find((_Hashtable<duckdb::ColumnBinding,_std::pair<const_duckdb::ColumnBinding,_duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>,_std::allocator<std::pair<const_duckdb::ColumnBinding,_duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>_>,_std::__detail::_Select1st,_duckdb::ColumnBindingEquality,_duckdb::ColumnBindingHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                        *)this_02,pCVar9);
        if (iVar6.
            super__Node_iterator_base<std::pair<const_duckdb::ColumnBinding,_duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>,_true>
            ._M_cur != (__node_type *)0x0) {
          pBVar7 = unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                   ::operator->((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                                 *)((long)iVar6.
                                          super__Node_iterator_base<std::pair<const_duckdb::ColumnBinding,_duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>,_true>
                                          ._M_cur + 0x18));
          BaseStatistics::Set(pBVar7,CAN_HAVE_NULL_VALUES);
        }
      }
      pvVar4 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
               ::get<true>(this_00,1);
      pLVar5 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
               ::operator->(pvVar4);
      (*pLVar5->_vptr_LogicalOperator[2])(&right_bindings,pLVar5);
      for (pCVar9 = right_bindings.
                    super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
                    super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pCVar9 != right_bindings.
                    super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
                    super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
                    ._M_impl.super__Vector_impl_data._M_finish; pCVar9 = pCVar9 + 1) {
        iVar6 = ::std::
                _Hashtable<duckdb::ColumnBinding,_std::pair<const_duckdb::ColumnBinding,_duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>,_std::allocator<std::pair<const_duckdb::ColumnBinding,_duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>_>,_std::__detail::_Select1st,_duckdb::ColumnBindingEquality,_duckdb::ColumnBindingHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::find((_Hashtable<duckdb::ColumnBinding,_std::pair<const_duckdb::ColumnBinding,_duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>,_std::allocator<std::pair<const_duckdb::ColumnBinding,_duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>_>,_std::__detail::_Select1st,_duckdb::ColumnBindingEquality,_duckdb::ColumnBindingHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                        *)this_02,pCVar9);
        if (iVar6.
            super__Node_iterator_base<std::pair<const_duckdb::ColumnBinding,_duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>,_true>
            ._M_cur != (__node_type *)0x0) {
          pBVar7 = unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                   ::operator->((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                                 *)((long)iVar6.
                                          super__Node_iterator_base<std::pair<const_duckdb::ColumnBinding,_duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>,_true>
                                          ._M_cur + 0x18));
          BaseStatistics::Set(pBVar7,CAN_HAVE_NULL_VALUES);
        }
      }
      this->optimizer = (Optimizer *)*this_01;
      *this_01 = (pointer)0x0;
      ::std::_Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>::
      ~_Vector_base((_Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_> *)
                    &right_bindings);
      ::std::_Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>::
      ~_Vector_base((_Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_> *)
                    &left_bindings);
      return (unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>_>)
             (unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>_>)this;
    }
    vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
    ::get<true>(this_00,__n);
    PropagateStatistics((StatisticsPropagator *)&right_bindings,
                        (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                         *)join);
    if (right_bindings.super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
        super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>._M_impl.
        super__Vector_impl_data._M_start == (pointer)0x0) {
LAB_01a77d6a:
      left_bindings.super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
      super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      ::std::__uniq_ptr_impl<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>_>::
      reset((__uniq_ptr_impl<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>_> *
            )this_01,(pointer)0x0);
      ::std::unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>_>::
      ~unique_ptr((unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>_>
                   *)&left_bindings);
    }
    else if (*this_01 != (pointer)0x0) {
      pNVar2 = unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>,_true>
               ::operator->((unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>,_true>
                             *)this_01);
      if (pNVar2->has_estimated_cardinality == true) {
        pNVar2 = unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>,_true>
                 ::operator->((unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>,_true>
                               *)&right_bindings);
        if (pNVar2->has_estimated_cardinality == true) {
          pNVar2 = unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>,_true>
                   ::operator->((unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>,_true>
                                 *)this_01);
          if (pNVar2->has_max_cardinality == true) {
            pNVar2 = unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>,_true>
                     ::operator->((unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>,_true>
                                   *)&right_bindings);
            if (pNVar2->has_max_cardinality != false) {
              pNVar3 = unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>,_true>
                       ::operator*((unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>,_true>
                                    *)&right_bindings);
              pNVar2 = unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>,_true>
                       ::operator->((unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>,_true>
                                     *)this_01);
              if ((pNVar2->has_estimated_cardinality == true) &&
                 (pNVar3->has_estimated_cardinality == true)) {
                pNVar2 = unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>,_true>
                         ::operator->((unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>,_true>
                                       *)this_01);
                if ((pNVar2->has_max_cardinality == true) && (pNVar3->has_max_cardinality != false))
                {
                  pNVar2 = unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>,_true>
                           ::operator->((unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>,_true>
                                         *)this_01);
                  uVar1 = pNVar2->estimated_cardinality;
                  uVar8 = pNVar3->estimated_cardinality;
                  pNVar2 = unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>,_true>
                           ::operator->((unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>,_true>
                                         *)this_01);
                  if (uVar8 < uVar1) {
                    uVar8 = uVar1;
                  }
                  pNVar2->estimated_cardinality = uVar8;
                  pNVar2 = unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>,_true>
                           ::operator->((unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>,_true>
                                         *)this_01);
                  uVar1 = pNVar2->max_cardinality;
                  uVar8 = pNVar3->max_cardinality;
                  pNVar2 = unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>,_true>
                           ::operator->((unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>,_true>
                                         *)this_01);
                  if (uVar8 < uVar1) {
                    uVar8 = uVar1;
                  }
                  pNVar2->max_cardinality = uVar8;
                  goto LAB_01a77d84;
                }
              }
            }
          }
        }
      }
      goto LAB_01a77d6a;
    }
LAB_01a77d84:
    ::std::unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>_>::
    ~unique_ptr((unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>_> *)
                &right_bindings);
    __n = __n + 1;
  } while( true );
}

Assistant:

unique_ptr<NodeStatistics> StatisticsPropagator::PropagateStatistics(LogicalPositionalJoin &join,
                                                                     unique_ptr<LogicalOperator> &node_ptr) {
	D_ASSERT(join.type == LogicalOperatorType::LOGICAL_POSITIONAL_JOIN);

	// first propagate through the children of the join
	node_stats = PropagateStatistics(join.children[0]);
	for (idx_t child_idx = 1; child_idx < join.children.size(); child_idx++) {
		auto child_stats = PropagateStatistics(join.children[child_idx]);
		if (!child_stats) {
			node_stats = nullptr;
		} else if (node_stats) {
			if (!node_stats->has_estimated_cardinality || !child_stats->has_estimated_cardinality ||
			    !node_stats->has_max_cardinality || !child_stats->has_max_cardinality) {
				node_stats = nullptr;
			} else {
				MaxCardinalities(node_stats, *child_stats);
			}
		}
	}

	// No conditions.

	// Positional Joins are always FULL OUTER

	// set IsNull() to true for all lhs statistics
	auto left_bindings = join.children[0]->GetColumnBindings();
	for (auto &binding : left_bindings) {
		auto stats = statistics_map.find(binding);
		if (stats != statistics_map.end()) {
			stats->second->Set(StatsInfo::CAN_HAVE_NULL_VALUES);
		}
	}

	// set IsNull() to true for all rhs statistics
	auto right_bindings = join.children[1]->GetColumnBindings();
	for (auto &binding : right_bindings) {
		auto stats = statistics_map.find(binding);
		if (stats != statistics_map.end()) {
			stats->second->Set(StatsInfo::CAN_HAVE_NULL_VALUES);
		}
	}

	return std::move(node_stats);
}